

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenComparatorForStruct
          (CppGenerator *this,StructDef *struct_def,size_t space_size,string *lhs_struct_literal,
          string *rhs_struct_literal)

{
  StructDef *pSVar1;
  string *psVar2;
  bool bVar3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  undefined1 *space_size_00;
  allocator<char> local_5c1;
  string local_5c0;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  Type local_328;
  Type *local_308;
  Type *elem_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined4 local_27c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  byte local_1f3;
  byte local_1f2;
  byte local_1f1;
  undefined1 local_1f0 [5];
  bool is_struct;
  bool is_array;
  bool is_scalar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  string curr_field_name;
  FieldDef **curr_field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  undefined1 local_b0 [8];
  string space;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *rhs_struct_literal_local;
  string *lhs_struct_literal_local;
  size_t space_size_local;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_30 = rhs_struct_literal;
  rhs_struct_literal_local = lhs_struct_literal;
  lhs_struct_literal_local = (string *)space_size;
  space_size_local = (size_t)struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"LHS_PREFIX",&local_51);
  CodeWriter::SetValue(&this->code_,&local_50,lhs_struct_literal);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"RHS_PREFIX",(allocator<char> *)(space.field_2._M_local_buf + 0xf))
  ;
  CodeWriter::SetValue(&this->code_,&local_88,rhs_struct_literal);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)(space.field_2._M_local_buf + 0xf));
  psVar2 = lhs_struct_literal_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,(size_type)psVar2,' ',(allocator<char> *)((long)&__range2 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  this_00 = (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
            (space_size_local + 0xf8);
  __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (this_00);
  curr_field = (FieldDef **)
               std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                         (this_00);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                *)&curr_field);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)local_b0);
      return;
    }
    curr_field_name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
         ::operator*(&__end2);
    Name_abi_cxx11_((string *)local_f8,this,*(FieldDef **)curr_field_name.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CURR_FIELD_NAME",&local_119);
    CodeWriter::SetValue(&this->code_,&local_118,(string *)local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"LHS",&local_141);
    std::operator+(&local_188,lhs_struct_literal,"_");
    std::operator+(&local_168,&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    CodeWriter::SetValue(&this->code_,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"RHS",&local_1a9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   rhs_struct_literal,"_");
    std::operator+(&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    CodeWriter::SetValue(&this->code_,&local_1a8,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    local_1f1 = IsScalar(*(BaseType *)(*(long *)curr_field_name.field_2._8_8_ + 200));
    local_1f2 = IsArray((Type *)(*(long *)curr_field_name.field_2._8_8_ + 200));
    local_1f3 = IsStruct((Type *)(*(long *)curr_field_name.field_2._8_8_ + 200));
    if ((*(byte *)(*(long *)curr_field_name.field_2._8_8_ + 0x111) & 1) == 0) {
      std::operator+(&local_2a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "const auto {{LHS}} = {{LHS_PREFIX}}.{{CURR_FIELD_NAME}}();");
      CodeWriter::operator+=(&this->code_,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::operator+(&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();");
      CodeWriter::operator+=(&this->code_,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      psVar2 = lhs_struct_literal_local;
      if ((local_1f1 & 1) == 0) {
        if ((local_1f2 & 1) == 0) {
          if ((local_1f3 & 1) != 0) {
            pSVar1 = *(StructDef **)(*(long *)curr_field_name.field_2._8_8_ + 0xd0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_578,"LHS",&local_579);
            CodeWriter::GetValue(&local_558,&this->code_,&local_578);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5c0,"RHS",&local_5c1);
            CodeWriter::GetValue(&local_5a0,&this->code_,&local_5c0);
            GenComparatorForStruct(this,pSVar1,(size_t)psVar2,&local_558,&local_5a0);
            std::__cxx11::string::~string((string *)&local_5a0);
            std::__cxx11::string::~string((string *)&local_5c0);
            std::allocator<char>::~allocator(&local_5c1);
            std::__cxx11::string::~string((string *)&local_558);
            std::__cxx11::string::~string((string *)&local_578);
            std::allocator<char>::~allocator(&local_579);
          }
        }
        else {
          Type::VectorType(&local_328,(Type *)(*(long *)curr_field_name.field_2._8_8_ + 200));
          local_308 = &local_328;
          std::operator+(&local_348,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"for (::flatbuffers::uoffset_t i = 0; i < {{LHS}}->size(); i++) {"
                        );
          CodeWriter::operator+=(&this->code_,&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          std::operator+(&local_368,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"  const auto {{LHS}}_elem = {{LHS}}->Get(i);");
          CodeWriter::operator+=(&this->code_,&local_368);
          std::__cxx11::string::~string((string *)&local_368);
          std::operator+(&local_388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"  const auto {{RHS}}_elem = {{RHS}}->Get(i);");
          CodeWriter::operator+=(&this->code_,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          bVar3 = IsScalar(local_308->base_type);
          if (bVar3) {
            std::operator+(&local_3a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0,"  if ({{LHS}}_elem != {{RHS}}_elem)");
            CodeWriter::operator+=(&this->code_,&local_3a8);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::operator+(&local_3c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0,
                           "    return static_cast<int>({{LHS}}_elem > {{RHS}}_elem) - static_cast<int>({{LHS}}_elem < {{RHS}}_elem);"
                          );
            CodeWriter::operator+=(&this->code_,&local_3c8);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::operator+(&local_3e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0,"}");
            CodeWriter::operator+=(&this->code_,&local_3e8);
            std::__cxx11::string::~string((string *)&local_3e8);
          }
          else {
            bVar3 = IsStruct(local_308);
            if (bVar3) {
              if ((*(byte *)(*(long *)curr_field_name.field_2._8_8_ + 0x111) & 1) != 0) {
                std::operator+(&local_408,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,
                               "const auto {{CURR_FIELD_NAME}}_compare_result = {{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});"
                              );
                CodeWriter::operator+=(&this->code_,&local_408);
                std::__cxx11::string::~string((string *)&local_408);
                std::operator+(&local_428,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,"if ({{CURR_FIELD_NAME}}_compare_result != 0)");
                CodeWriter::operator+=(&this->code_,&local_428);
                std::__cxx11::string::~string((string *)&local_428);
                std::operator+(&local_448,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,"  return {{CURR_FIELD_NAME}}_compare_result;");
                CodeWriter::operator+=(&this->code_,&local_448);
                std::__cxx11::string::~string((string *)&local_448);
                local_27c = 3;
                goto LAB_001fed3c;
              }
              pSVar1 = *(StructDef **)(*(long *)curr_field_name.field_2._8_8_ + 0xd0);
              space_size_00 = &lhs_struct_literal_local->field_0x2;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4a8,"LHS",&local_4a9);
              CodeWriter::GetValue(&local_488,&this->code_,&local_4a8);
              std::operator+(&local_468,&local_488,"_elem");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_510,"RHS",&local_511);
              CodeWriter::GetValue(&local_4f0,&this->code_,&local_510);
              std::operator+(&local_4d0,&local_4f0,"_elem");
              GenComparatorForStruct(this,pSVar1,(size_t)space_size_00,&local_468,&local_4d0);
              std::__cxx11::string::~string((string *)&local_4d0);
              std::__cxx11::string::~string((string *)&local_4f0);
              std::__cxx11::string::~string((string *)&local_510);
              std::allocator<char>::~allocator(&local_511);
              std::__cxx11::string::~string((string *)&local_468);
              std::__cxx11::string::~string((string *)&local_488);
              std::__cxx11::string::~string((string *)&local_4a8);
              std::allocator<char>::~allocator(&local_4a9);
              std::operator+(&local_538,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b0,"}");
              CodeWriter::operator+=(&this->code_,&local_538);
              std::__cxx11::string::~string((string *)&local_538);
            }
          }
        }
      }
      else {
        std::operator+(&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"if ({{LHS}} != {{RHS}})");
        CodeWriter::operator+=(&this->code_,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &elem_type,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,
                       "  return static_cast<int>({{LHS}} > {{RHS}}) - static_cast<int>({{LHS}} < {{RHS}});"
                      );
        CodeWriter::operator+=(&this->code_,(string *)&elem_type);
        std::__cxx11::string::~string((string *)&elem_type);
      }
      local_27c = 0;
    }
    else {
      std::operator+(&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();");
      CodeWriter::operator+=(&this->code_,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator+(&local_238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "const auto {{CURR_FIELD_NAME}}_compare_result = {{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});"
                    );
      CodeWriter::operator+=(&this->code_,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::operator+(&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "if ({{CURR_FIELD_NAME}}_compare_result != 0)");
      CodeWriter::operator+=(&this->code_,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::operator+(&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "  return {{CURR_FIELD_NAME}}_compare_result;");
      CodeWriter::operator+=(&this->code_,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      local_27c = 3;
    }
LAB_001fed3c:
    std::__cxx11::string::~string((string *)local_f8);
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void GenComparatorForStruct(const StructDef &struct_def, size_t space_size,
                              const std::string lhs_struct_literal,
                              const std::string rhs_struct_literal) {
    code_.SetValue("LHS_PREFIX", lhs_struct_literal);
    code_.SetValue("RHS_PREFIX", rhs_struct_literal);
    std::string space(space_size, ' ');
    for (const auto &curr_field : struct_def.fields.vec) {
      const auto curr_field_name = Name(*curr_field);
      code_.SetValue("CURR_FIELD_NAME", curr_field_name);
      code_.SetValue("LHS", lhs_struct_literal + "_" + curr_field_name);
      code_.SetValue("RHS", rhs_struct_literal + "_" + curr_field_name);
      const bool is_scalar = IsScalar(curr_field->value.type.base_type);
      const bool is_array = IsArray(curr_field->value.type);
      const bool is_struct = IsStruct(curr_field->value.type);

      // If encouter a key field, call KeyCompareWithValue to compare this
      // field.
      if (curr_field->key) {
        code_ += space +
                 "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
        code_ += space +
                 "const auto {{CURR_FIELD_NAME}}_compare_result = "
                 "{{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});";

        code_ += space + "if ({{CURR_FIELD_NAME}}_compare_result != 0)";
        code_ += space + "  return {{CURR_FIELD_NAME}}_compare_result;";
        continue;
      }

      code_ +=
          space + "const auto {{LHS}} = {{LHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
      code_ +=
          space + "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
      if (is_scalar) {
        code_ += space + "if ({{LHS}} != {{RHS}})";
        code_ += space +
                 "  return static_cast<int>({{LHS}} > {{RHS}}) - "
                 "static_cast<int>({{LHS}} < {{RHS}});";
      } else if (is_array) {
        const auto &elem_type = curr_field->value.type.VectorType();
        code_ +=
            space +
            "for (::flatbuffers::uoffset_t i = 0; i < {{LHS}}->size(); i++) {";
        code_ += space + "  const auto {{LHS}}_elem = {{LHS}}->Get(i);";
        code_ += space + "  const auto {{RHS}}_elem = {{RHS}}->Get(i);";
        if (IsScalar(elem_type.base_type)) {
          code_ += space + "  if ({{LHS}}_elem != {{RHS}}_elem)";
          code_ += space +
                   "    return static_cast<int>({{LHS}}_elem > {{RHS}}_elem) - "
                   "static_cast<int>({{LHS}}_elem < {{RHS}}_elem);";
          code_ += space + "}";

        } else if (IsStruct(elem_type)) {
          if (curr_field->key) {
            code_ += space +
                     "const auto {{CURR_FIELD_NAME}}_compare_result = "
                     "{{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});";
            code_ += space + "if ({{CURR_FIELD_NAME}}_compare_result != 0)";
            code_ += space + "  return {{CURR_FIELD_NAME}}_compare_result;";
            continue;
          }
          GenComparatorForStruct(
              *curr_field->value.type.struct_def, space_size + 2,
              code_.GetValue("LHS") + "_elem", code_.GetValue("RHS") + "_elem");

          code_ += space + "}";
        }

      } else if (is_struct) {
        GenComparatorForStruct(*curr_field->value.type.struct_def, space_size,
                               code_.GetValue("LHS"), code_.GetValue("RHS"));
      }
    }
  }